

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-effect.c
# Opt level: O0

int effect_menu_select(menu_conflict *m,char *prompt,_Bool allow_random)

{
  ui_event uVar1;
  char *local_50;
  int local_2c;
  int selection;
  ui_event out;
  _Bool allow_random_local;
  char *prompt_local;
  menu_conflict *m_local;
  
  screen_save();
  region_erase_bordered(&m->active);
  local_50 = prompt;
  if (prompt == (char *)0x0) {
    local_50 = "Which effect? ";
  }
  prt(local_50,L'\0',L'\0');
  uVar1 = menu_select(m,0,false);
  if (((undefined1  [12])uVar1 & (undefined1  [12])0x40) == (undefined1  [12])0x0) {
    local_2c = -1;
  }
  else {
    local_2c = m->cursor;
    if (allow_random) {
      if (local_2c == 0) {
        local_2c = -2;
      }
      else if (0 < local_2c) {
        local_2c = local_2c + -1;
      }
    }
  }
  screen_load();
  return local_2c;
}

Assistant:

static int effect_menu_select(struct menu *m, const char *prompt,			bool allow_random)
{
	ui_event out;
	int selection;

	screen_save();
	region_erase_bordered(&m->active);
	prt((prompt) ? prompt : "Which effect? ", 0, 0);
	out = menu_select(m, 0, false);
	if (out.type & EVT_SELECT) {
		selection = m->cursor;
		if (allow_random) {
			if (selection == 0) {
				selection = -2;
			} else if (selection > 0) {
				--selection;
			}
		}
	} else {
		selection = -1;
	}
	screen_load();

	return selection;
}